

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cc
# Opt level: O0

Uint wabt::anon_unknown_0::FloatParser<float>::Make(bool sign,int exp,Uint sig)

{
  Uint sig_local;
  int exp_local;
  bool sign_local;
  
  if (exp < -0x7f || 0x80 < exp) {
    __assert_fail("exp >= Traits::kMinExp && exp <= Traits::kMaxExp",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/literal.cc"
                  ,0xb8,
                  "static typename FloatParser<T>::Uint wabt::(anonymous namespace)::FloatParser<float>::Make(bool, int, Uint) [T = float]"
                 );
  }
  if (sig < 0x800000) {
    return (uint)sign << 0x1f | (exp + 0x7f) * 0x800000 | sig;
  }
  __assert_fail("sig <= Traits::kSigMask",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/literal.cc"
                ,0xb9,
                "static typename FloatParser<T>::Uint wabt::(anonymous namespace)::FloatParser<float>::Make(bool, int, Uint) [T = float]"
               );
}

Assistant:

typename FloatParser<T>::Uint FloatParser<T>::Make(bool sign,
                                                   int exp,
                                                   Uint sig) {
  assert(exp >= Traits::kMinExp && exp <= Traits::kMaxExp);
  assert(sig <= Traits::kSigMask);
  return (Uint(sign) << Traits::kSignShift) |
         (Uint(exp + Traits::kExpBias) << Traits::kSigBits) | sig;
}